

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

size_t __thiscall
proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator::ByteSizeLong
          (TestParsingMergeLite_RepeatedFieldsGenerator *this)

{
  RepeatedPtrField<proto2_unittest::TestAllTypesLite> *pRVar1;
  RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group1> *this_00;
  RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2> *this_01;
  ulong uVar2;
  void **ppvVar3;
  const_iterator cVar4;
  size_t sVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  size_t sVar8;
  long lVar9;
  
  lVar9 = (long)*(int *)((long)&this->field_0 + 8);
  ppvVar3 = google::protobuf::internal::RepeatedPtrFieldBase::elements
                      ((RepeatedPtrFieldBase *)&(this->field_0)._impl_);
  cVar4 = google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::end
                    (&(this->field_0)._impl_.field1_);
  for (; ppvVar3 != cVar4.it_; ppvVar3 = ppvVar3 + 1) {
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<proto2_unittest::TestAllTypesLite>((TestAllTypesLite *)*ppvVar3);
    lVar9 = lVar9 + sVar5;
  }
  lVar9 = lVar9 + *(int *)((long)&this->field_0 + 0x20);
  pRVar1 = &(this->field_0)._impl_.field2_;
  ppvVar3 = google::protobuf::internal::RepeatedPtrFieldBase::elements
                      (&pRVar1->super_RepeatedPtrFieldBase);
  cVar4 = google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::end(pRVar1);
  for (; ppvVar3 != cVar4.it_; ppvVar3 = ppvVar3 + 1) {
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<proto2_unittest::TestAllTypesLite>((TestAllTypesLite *)*ppvVar3);
    lVar9 = lVar9 + sVar5;
  }
  lVar9 = lVar9 + *(int *)((long)&this->field_0 + 0x38);
  pRVar1 = &(this->field_0)._impl_.field3_;
  ppvVar3 = google::protobuf::internal::RepeatedPtrFieldBase::elements
                      (&pRVar1->super_RepeatedPtrFieldBase);
  cVar4 = google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::end(pRVar1);
  for (; ppvVar3 != cVar4.it_; ppvVar3 = ppvVar3 + 1) {
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<proto2_unittest::TestAllTypesLite>((TestAllTypesLite *)*ppvVar3);
    lVar9 = lVar9 + sVar5;
  }
  lVar9 = lVar9 + (long)*(int *)((long)&this->field_0 + 0x50) * 2;
  this_00 = &(this->field_0)._impl_.group1_;
  ppvVar3 = google::protobuf::internal::RepeatedPtrFieldBase::elements
                      (&this_00->super_RepeatedPtrFieldBase);
  cVar6 = google::protobuf::
          RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group1>::
          end(this_00);
  for (; ppvVar3 != cVar6.it_; ppvVar3 = ppvVar3 + 1) {
    sVar5 = TestParsingMergeLite_RepeatedFieldsGenerator_Group1::ByteSizeLong
                      ((TestParsingMergeLite_RepeatedFieldsGenerator_Group1 *)*ppvVar3);
    lVar9 = lVar9 + sVar5;
  }
  lVar9 = lVar9 + (long)*(int *)((long)&this->field_0 + 0x68) * 4;
  this_01 = &(this->field_0)._impl_.group2_;
  ppvVar3 = google::protobuf::internal::RepeatedPtrFieldBase::elements
                      (&this_01->super_RepeatedPtrFieldBase);
  cVar7 = google::protobuf::
          RepeatedPtrField<proto2_unittest::TestParsingMergeLite_RepeatedFieldsGenerator_Group2>::
          end(this_01);
  for (; ppvVar3 != cVar7.it_; ppvVar3 = ppvVar3 + 1) {
    sVar5 = TestParsingMergeLite_RepeatedFieldsGenerator_Group2::ByteSizeLong
                      ((TestParsingMergeLite_RepeatedFieldsGenerator_Group2 *)*ppvVar3);
    lVar9 = lVar9 + sVar5;
  }
  lVar9 = lVar9 + (long)*(int *)((long)&this->field_0 + 0x80) * 2;
  pRVar1 = &(this->field_0)._impl_.ext1_;
  ppvVar3 = google::protobuf::internal::RepeatedPtrFieldBase::elements
                      (&pRVar1->super_RepeatedPtrFieldBase);
  cVar4 = google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::end(pRVar1);
  for (; ppvVar3 != cVar4.it_; ppvVar3 = ppvVar3 + 1) {
    sVar5 = google::protobuf::internal::WireFormatLite::
            MessageSize<proto2_unittest::TestAllTypesLite>((TestAllTypesLite *)*ppvVar3);
    lVar9 = lVar9 + sVar5;
  }
  sVar5 = lVar9 + (long)*(int *)((long)&this->field_0 + 0x98) * 2;
  pRVar1 = &(this->field_0)._impl_.ext2_;
  ppvVar3 = google::protobuf::internal::RepeatedPtrFieldBase::elements
                      (&pRVar1->super_RepeatedPtrFieldBase);
  cVar4 = google::protobuf::RepeatedPtrField<proto2_unittest::TestAllTypesLite>::end(pRVar1);
  for (; ppvVar3 != cVar4.it_; ppvVar3 = ppvVar3 + 1) {
    sVar8 = google::protobuf::internal::WireFormatLite::
            MessageSize<proto2_unittest::TestAllTypesLite>((TestAllTypesLite *)*ppvVar3);
    sVar5 = sVar5 + sVar8;
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    sVar5 = sVar5 + *(long *)((uVar2 & 0xfffffffffffffffe) + 0x10);
  }
  if (((int)sVar5 != 0) || ((this->field_0)._impl_._cached_size_.atom_ != 0)) {
    (this->field_0)._impl_._cached_size_.atom_ = (int)sVar5;
  }
  return sVar5;
}

Assistant:

::size_t TestParsingMergeLite_RepeatedFieldsGenerator::ByteSizeLong() const {
  const TestParsingMergeLite_RepeatedFieldsGenerator& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestParsingMergeLite.RepeatedFieldsGenerator)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .proto2_unittest.TestAllTypesLite field1 = 1;
    {
      total_size += 1UL * this_._internal_field1_size();
      for (const auto& msg : this_._internal_field1()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_unittest.TestAllTypesLite field2 = 2;
    {
      total_size += 1UL * this_._internal_field2_size();
      for (const auto& msg : this_._internal_field2()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_unittest.TestAllTypesLite field3 = 3;
    {
      total_size += 1UL * this_._internal_field3_size();
      for (const auto& msg : this_._internal_field3()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_unittest.TestParsingMergeLite.RepeatedFieldsGenerator.Group1 group1 = 10 [features = {
    {
      total_size += 2UL * this_._internal_group1_size();
      for (const auto& msg : this_._internal_group1()) {
        total_size += ::google::protobuf::internal::WireFormatLite::GroupSize(msg);
      }
    }
    // repeated .proto2_unittest.TestParsingMergeLite.RepeatedFieldsGenerator.Group2 group2 = 20 [features = {
    {
      total_size += 4UL * this_._internal_group2_size();
      for (const auto& msg : this_._internal_group2()) {
        total_size += ::google::protobuf::internal::WireFormatLite::GroupSize(msg);
      }
    }
    // repeated .proto2_unittest.TestAllTypesLite ext1 = 1000;
    {
      total_size += 2UL * this_._internal_ext1_size();
      for (const auto& msg : this_._internal_ext1()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
    // repeated .proto2_unittest.TestAllTypesLite ext2 = 1001;
    {
      total_size += 2UL * this_._internal_ext2_size();
      for (const auto& msg : this_._internal_ext2()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    total_size += this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size();
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}